

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

UChar32 __thiscall
icu_63::CollationIterator::nextSkippedCodePoint(CollationIterator *this,UErrorCode *errorCode)

{
  SkippedState *pSVar1;
  UBool UVar2;
  UChar32 UVar3;
  int iVar4;
  
  if (this->skipped != (SkippedState *)0x0) {
    UVar2 = SkippedState::hasNext(this->skipped);
    if (UVar2 != '\0') {
      UVar3 = SkippedState::next(this->skipped);
      return UVar3;
    }
  }
  if (this->numCpFwd == 0) {
    iVar4 = -1;
  }
  else {
    iVar4 = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode);
    pSVar1 = this->skipped;
    if (((pSVar1 != (SkippedState *)0x0) && (-1 < iVar4)) &&
       (0x1f < (ushort)(pSVar1->oldBuffer).fUnion.fStackFields.fLengthAndFlags)) {
      pSVar1->pos = pSVar1->pos + 1;
    }
    if (-1 < iVar4 && 0 < this->numCpFwd) {
      this->numCpFwd = this->numCpFwd + -1;
    }
  }
  return iVar4;
}

Assistant:

UChar32
CollationIterator::nextSkippedCodePoint(UErrorCode &errorCode) {
    if(skipped != NULL && skipped->hasNext()) { return skipped->next(); }
    if(numCpFwd == 0) { return U_SENTINEL; }
    UChar32 c = nextCodePoint(errorCode);
    if(skipped != NULL && !skipped->isEmpty() && c >= 0) { skipped->incBeyond(); }
    if(numCpFwd > 0 && c >= 0) { --numCpFwd; }
    return c;
}